

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

PaError Pa_UpdateAvailableDeviceList(void)

{
  int iVar1;
  _func_PaError_PaUtilHostApiRepresentation_ptr_PaHostApiIndex_void_ptr_ptr_int_ptr *p_Var2;
  _func_PaError_PaUtilHostApiRepresentation_ptr_void_ptr_int *p_Var3;
  PaUtilHostApiRepresentation *pPVar4;
  PaError PVar5;
  void **block;
  void **ppvVar6;
  PaUtilHostApiRepresentation **ppPVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  void **ppvVar11;
  ulong uVar12;
  void **ppvVar13;
  ulong uVar14;
  long lVar15;
  
  if (initializationCount_ == 0) {
    PVar5 = -10000;
  }
  else {
    block = (void **)PaUtil_AllocateMemory((long)hostApisCount_ << 3);
    if (block == (void **)0x0) {
      PVar5 = -0x2708;
    }
    else {
      ppvVar6 = (void **)PaUtil_AllocateMemory((long)hostApisCount_ << 2);
      if (ppvVar6 == (void **)0x0) {
        PVar5 = -0x2708;
      }
      else {
        if (hostApisCount_ < 1) {
          deviceCount_ = 0;
        }
        else {
          uVar14 = 0;
          ppPVar7 = hostApis_;
          ppvVar11 = block;
          ppvVar13 = ppvVar6;
          iVar8 = hostApisCount_;
          do {
            p_Var2 = ppPVar7[uVar14]->ScanDeviceInfos;
            if ((p_Var2 != (_func_PaError_PaUtilHostApiRepresentation_ptr_PaHostApiIndex_void_ptr_ptr_int_ptr
                            *)0x0) &&
               (PVar5 = (*p_Var2)(ppPVar7[uVar14],(PaHostApiIndex)uVar14,ppvVar11,(int *)ppvVar13),
               ppPVar7 = hostApis_, iVar8 = hostApisCount_, PVar5 != 0)) break;
            uVar14 = uVar14 + 1;
            ppvVar13 = (void **)((long)ppvVar13 + 4);
            ppvVar11 = ppvVar11 + 1;
          } while ((long)uVar14 < (long)iVar8);
          if ((int)uVar14 < iVar8) {
            if ((int)uVar14 != 0) {
              uVar12 = 0;
              ppPVar7 = hostApis_;
              do {
                p_Var3 = ppPVar7[uVar12]->DisposeDeviceInfos;
                if (p_Var3 != (_func_PaError_PaUtilHostApiRepresentation_ptr_void_ptr_int *)0x0) {
                  (*p_Var3)(ppPVar7[uVar12],block[uVar12],*(int *)((long)ppvVar6 + uVar12 * 4));
                  ppPVar7 = hostApis_;
                }
                uVar12 = uVar12 + 1;
              } while ((uVar14 & 0xffffffff) != uVar12);
            }
          }
          else {
            deviceCount_ = 0;
            if (0 < iVar8) {
              lVar15 = 0;
              iVar9 = 0;
              ppPVar7 = hostApis_;
              do {
                pPVar4 = ppPVar7[lVar15];
                if (pPVar4->CommitDeviceInfos ==
                    (_func_PaError_PaUtilHostApiRepresentation_ptr_PaHostApiIndex_void_ptr_int *)0x0
                   ) {
                  iVar10 = (pPVar4->info).deviceCount;
                  deviceCount_ = deviceCount_ + iVar10;
                }
                else {
                  PVar5 = (*pPVar4->CommitDeviceInfos)
                                    (pPVar4,(PaHostApiIndex)lVar15,block[lVar15],
                                     *(int *)((long)ppvVar6 + lVar15 * 4));
                  ppPVar7 = hostApis_;
                  if (PVar5 != 0) {
                    PVar5 = -0x2702;
                    goto LAB_0010afbf;
                  }
                  iVar10 = (pPVar4->info).deviceCount;
                  iVar8 = (pPVar4->info).defaultInputDevice;
                  if (iVar10 <= iVar8) {
                    __assert_fail("hostApi->info.defaultInputDevice < hostApi->info.deviceCount",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/common/pa_front.c"
                                  ,0x34c,"PaError Pa_UpdateAvailableDeviceList(void)");
                  }
                  iVar1 = (pPVar4->info).defaultOutputDevice;
                  if (iVar10 <= iVar1) {
                    __assert_fail("hostApi->info.defaultOutputDevice < hostApi->info.deviceCount",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/common/pa_front.c"
                                  ,0x34d,"PaError Pa_UpdateAvailableDeviceList(void)");
                  }
                  (pPVar4->privatePaFrontInfo).baseDeviceIndex = (long)iVar9;
                  if (iVar8 != -1) {
                    (pPVar4->info).defaultInputDevice = iVar8 + iVar9;
                  }
                  if (iVar1 != -1) {
                    (pPVar4->info).defaultOutputDevice = iVar1 + iVar9;
                  }
                  deviceCount_ = deviceCount_ + iVar10;
                  iVar8 = hostApisCount_;
                }
                iVar9 = iVar9 + iVar10;
                lVar15 = lVar15 + 1;
              } while (lVar15 < iVar8);
            }
          }
        }
        PVar5 = 0;
LAB_0010afbf:
        PaUtil_FreeMemory(block);
        block = ppvVar6;
      }
      PaUtil_FreeMemory(block);
    }
  }
  return PVar5;
}

Assistant:

PaError Pa_UpdateAvailableDeviceList( void )
{
    PaError result     = paNoError;
    void **scanResults = NULL;
    int  *deviceCounts = NULL;
    int i = 0;

    PA_LOGAPI_ENTER( "Pa_UpdateAvailableDeviceList" );
    if( !PA_IS_INITIALISED_ )
    {
        result = paNotInitialized;
        goto done;
    }

    /* Allocate data structures used in 2-stage commit */
    scanResults = (void **) PaUtil_AllocateMemory( sizeof(void*) * hostApisCount_ );
    if( !scanResults )
    {
        result = paInsufficientMemory;
        goto done;
    }

    deviceCounts = ( int * ) PaUtil_AllocateMemory( sizeof( int ) * hostApisCount_ );
    if( !deviceCounts )
    {
        result = paInsufficientMemory;
        goto done;
    }

    /* Phase 1: Perform a scan of new devices */
    for( i = 0 ; i < hostApisCount_ ; ++i )
    {
        PaUtilHostApiRepresentation *hostApi = hostApis_[i];
        PA_DEBUG(( "Scanning new device list for host api %d.\n",i));
        if( hostApi->ScanDeviceInfos == NULL )
            continue;

        if( hostApi->ScanDeviceInfos( hostApi, i, &scanResults[ i ], &deviceCounts[ i ] ) != paNoError )
            break;
    }

    /* Check the result of the scan operation */
    if( i < hostApisCount_ )
    {
        /* If failure, rollback the scan changes back to original state */
        int j = 0;
        for( j = 0 ; j < i ; ++j )
        {
            PaUtilHostApiRepresentation *hostApi = hostApis_[j];
            if( hostApi->DisposeDeviceInfos == NULL )
                continue;

            PA_DEBUG(( "Performing rollback for device list scan for host api %d.\n",i));
            hostApi->DisposeDeviceInfos( hostApi, scanResults[ j ], deviceCounts[ j ] );
        }
    }
    else
    {
        int baseDeviceIndex = 0;
        deviceCount_ = 0;

        /* Otherwise, commit the scan changes to each back-end */
        for( i = 0 ; i < hostApisCount_ ; ++i )
        {
            PaUtilHostApiRepresentation *hostApi = hostApis_[i];
            if( hostApi->CommitDeviceInfos == NULL )
            {
                /* Not yet implemented for this backend. Just
                   assume that the baseDeviceIndex and the paInternalInfo_.deviceCount_ are
                   incremented according to the values in the info */
                baseDeviceIndex += hostApi->info.deviceCount;
                deviceCount_ += hostApi->info.deviceCount;
                continue;
            }

            PA_DEBUG(( "Committing device list scan for host api %d.\n",i));
            if( hostApi->CommitDeviceInfos( hostApi, i, scanResults[ i ], deviceCounts[ i ] ) != paNoError )
            {
                PA_DEBUG(( "Committing failed (shouldn't happen) %d.\n",i));
                result = paInternalError;
                goto done;
            }

            assert( hostApi->info.defaultInputDevice < hostApi->info.deviceCount );
            assert( hostApi->info.defaultOutputDevice < hostApi->info.deviceCount );

            hostApi->privatePaFrontInfo.baseDeviceIndex = baseDeviceIndex;

            if( hostApi->info.defaultInputDevice != paNoDevice )
                hostApi->info.defaultInputDevice += baseDeviceIndex;

            if( hostApi->info.defaultOutputDevice != paNoDevice )
                hostApi->info.defaultOutputDevice += baseDeviceIndex;

            baseDeviceIndex += hostApi->info.deviceCount;
            deviceCount_ += hostApi->info.deviceCount;
        }
    }

done:

    if( scanResults )
        PaUtil_FreeMemory( scanResults );

    if( deviceCounts )
        PaUtil_FreeMemory( deviceCounts );

    return result;
}